

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::replace_illegal_names(CompilerHLSL *this)

{
  int iVar1;
  long lVar2;
  undefined1 local_1040;
  undefined1 local_103f;
  undefined1 local_103e;
  allocator local_103d;
  allocator local_103c;
  allocator local_103b;
  allocator local_103a;
  allocator local_1039;
  allocator local_1038;
  allocator local_1037;
  allocator local_1036;
  allocator local_1035;
  allocator local_1034;
  allocator local_1033;
  allocator local_1032;
  allocator local_1031;
  allocator local_1030;
  allocator local_102f;
  allocator local_102e;
  allocator local_102d;
  allocator local_102c;
  allocator local_102b;
  allocator local_102a;
  allocator local_1029;
  allocator local_1028;
  allocator local_1027;
  allocator local_1026;
  allocator local_1025;
  allocator local_1024;
  allocator local_1023;
  allocator local_1022;
  allocator local_1021;
  allocator local_1020;
  allocator local_101f;
  allocator local_101e;
  allocator local_101d;
  allocator local_101c;
  allocator local_101b;
  allocator local_101a;
  allocator local_1019;
  allocator local_1018;
  allocator local_1017;
  allocator local_1016;
  allocator local_1015;
  allocator local_1014;
  allocator local_1013;
  allocator local_1012;
  allocator local_1011;
  allocator local_1010;
  allocator local_100f;
  allocator local_100e;
  allocator local_100d;
  allocator local_100c;
  allocator local_100b;
  allocator local_100a;
  allocator local_1009;
  allocator local_1008;
  allocator local_1007;
  allocator local_1006;
  allocator local_1005;
  allocator local_1004;
  allocator local_1003;
  allocator local_1002;
  allocator local_1001;
  allocator local_1000;
  allocator local_fff;
  allocator local_ffe;
  allocator local_ffd;
  allocator local_ffc;
  allocator local_ffb;
  allocator local_ffa;
  allocator local_ff9;
  allocator local_ff8;
  allocator local_ff7;
  allocator local_ff6;
  allocator local_ff5;
  allocator local_ff4;
  allocator local_ff3;
  allocator local_ff2;
  allocator local_ff1;
  allocator local_ff0;
  allocator local_fef;
  allocator local_fee;
  allocator local_fed;
  allocator local_fec;
  allocator local_feb;
  allocator local_fea;
  allocator local_fe9;
  allocator local_fe8;
  allocator local_fe7;
  allocator local_fe6;
  allocator local_fe5;
  allocator local_fe4;
  allocator local_fe3;
  allocator local_fe2;
  allocator local_fe1;
  allocator local_fe0;
  allocator local_fdf;
  allocator local_fde;
  allocator local_fdd;
  allocator local_fdc;
  allocator local_fdb;
  allocator local_fda;
  allocator local_fd9;
  allocator local_fd8;
  allocator local_fd7;
  allocator local_fd6;
  allocator local_fd5;
  allocator local_fd4;
  allocator local_fd3;
  allocator local_fd2;
  allocator local_fd1;
  allocator local_fd0;
  allocator local_fcf;
  allocator local_fce;
  allocator local_fcd;
  allocator local_fcc;
  allocator local_fcb;
  allocator local_fca;
  allocator local_fc9;
  allocator local_fc8;
  allocator local_fc7;
  allocator local_fc6;
  allocator local_fc5;
  allocator local_fc4;
  allocator local_fc3;
  allocator local_fc2;
  allocator local_fc1;
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [32];
  string local_e60 [32];
  string local_e40 [32];
  string local_e20 [32];
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  string local_d40 [32];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  if (replace_illegal_names()::keywords_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&replace_illegal_names()::keywords_abi_cxx11_);
    if (iVar1 != 0) {
      ::std::__cxx11::string::string(local_fc0,"AppendStructuredBuffer",&local_fc1);
      ::std::__cxx11::string::string(local_fa0,"asm",&local_fc2);
      ::std::__cxx11::string::string(local_f80,"asm_fragment",&local_fc3);
      ::std::__cxx11::string::string(local_f60,"BlendState",&local_fc4);
      ::std::__cxx11::string::string(local_f40,"bool",&local_fc5);
      ::std::__cxx11::string::string(local_f20,"break",&local_fc6);
      ::std::__cxx11::string::string(local_f00,"Buffer",&local_fc7);
      ::std::__cxx11::string::string(local_ee0,"ByteAddressBuffer",&local_fc8);
      ::std::__cxx11::string::string(local_ec0,"case",&local_fc9);
      ::std::__cxx11::string::string(local_ea0,"cbuffer",&local_fca);
      ::std::__cxx11::string::string(local_e80,"centroid",&local_fcb);
      ::std::__cxx11::string::string(local_e60,"class",&local_fcc);
      ::std::__cxx11::string::string(local_e40,"column_major",&local_fcd);
      ::std::__cxx11::string::string(local_e20,"compile",&local_fce);
      ::std::__cxx11::string::string(local_e00,"compile_fragment",&local_fcf);
      ::std::__cxx11::string::string(local_de0,"CompileShader",&local_fd0);
      ::std::__cxx11::string::string(local_dc0,"const",&local_fd1);
      ::std::__cxx11::string::string(local_da0,"continue",&local_fd2);
      ::std::__cxx11::string::string(local_d80,"ComputeShader",&local_fd3);
      ::std::__cxx11::string::string(local_d60,"ConsumeStructuredBuffer",&local_fd4);
      ::std::__cxx11::string::string(local_d40,"default",&local_fd5);
      ::std::__cxx11::string::string(local_d20,"DepthStencilState",&local_fd6);
      ::std::__cxx11::string::string(local_d00,"DepthStencilView",&local_fd7);
      ::std::__cxx11::string::string(local_ce0,"discard",&local_fd8);
      ::std::__cxx11::string::string(local_cc0,"do",&local_fd9);
      ::std::__cxx11::string::string(local_ca0,"double",&local_fda);
      ::std::__cxx11::string::string(local_c80,"DomainShader",&local_fdb);
      ::std::__cxx11::string::string(local_c60,"dword",&local_fdc);
      ::std::__cxx11::string::string(local_c40,"else",&local_fdd);
      ::std::__cxx11::string::string(local_c20,"export",&local_fde);
      ::std::__cxx11::string::string(local_c00,"false",&local_fdf);
      ::std::__cxx11::string::string(local_be0,"float",&local_fe0);
      ::std::__cxx11::string::string(local_bc0,"for",&local_fe1);
      ::std::__cxx11::string::string(local_ba0,"fxgroup",&local_fe2);
      ::std::__cxx11::string::string(local_b80,"GeometryShader",&local_fe3);
      ::std::__cxx11::string::string(local_b60,"groupshared",&local_fe4);
      ::std::__cxx11::string::string(local_b40,"half",&local_fe5);
      ::std::__cxx11::string::string(local_b20,"HullShader",&local_fe6);
      ::std::__cxx11::string::string(local_b00,"indices",&local_fe7);
      ::std::__cxx11::string::string(local_ae0,"if",&local_fe8);
      ::std::__cxx11::string::string(local_ac0,"in",&local_fe9);
      ::std::__cxx11::string::string(local_aa0,"inline",&local_fea);
      ::std::__cxx11::string::string(local_a80,"inout",&local_feb);
      ::std::__cxx11::string::string(local_a60,"InputPatch",&local_fec);
      ::std::__cxx11::string::string(local_a40,"int",&local_fed);
      ::std::__cxx11::string::string(local_a20,"interface",&local_fee);
      ::std::__cxx11::string::string(local_a00,"line",&local_fef);
      ::std::__cxx11::string::string(local_9e0,"lineadj",&local_ff0);
      ::std::__cxx11::string::string(local_9c0,"linear",&local_ff1);
      ::std::__cxx11::string::string(local_9a0,"LineStream",&local_ff2);
      ::std::__cxx11::string::string(local_980,"matrix",&local_ff3);
      ::std::__cxx11::string::string(local_960,"min16float",&local_ff4);
      ::std::__cxx11::string::string(local_940,"min10float",&local_ff5);
      ::std::__cxx11::string::string(local_920,"min16int",&local_ff6);
      ::std::__cxx11::string::string(local_900,"min16uint",&local_ff7);
      ::std::__cxx11::string::string(local_8e0,"namespace",&local_ff8);
      ::std::__cxx11::string::string(local_8c0,"nointerpolation",&local_ff9);
      ::std::__cxx11::string::string(local_8a0,"noperspective",&local_ffa);
      ::std::__cxx11::string::string(local_880,"NULL",&local_ffb);
      ::std::__cxx11::string::string(local_860,"out",&local_ffc);
      ::std::__cxx11::string::string(local_840,"OutputPatch",&local_ffd);
      ::std::__cxx11::string::string(local_820,"payload",&local_ffe);
      ::std::__cxx11::string::string(local_800,"packoffset",&local_fff);
      ::std::__cxx11::string::string(local_7e0,"pass",&local_1000);
      ::std::__cxx11::string::string(local_7c0,"pixelfragment",&local_1001);
      ::std::__cxx11::string::string(local_7a0,"PixelShader",&local_1002);
      ::std::__cxx11::string::string(local_780,"point",&local_1003);
      ::std::__cxx11::string::string(local_760,"PointStream",&local_1004);
      ::std::__cxx11::string::string(local_740,"precise",&local_1005);
      ::std::__cxx11::string::string(local_720,"RasterizerState",&local_1006);
      ::std::__cxx11::string::string(local_700,"RenderTargetView",&local_1007);
      ::std::__cxx11::string::string(local_6e0,"return",&local_1008);
      ::std::__cxx11::string::string(local_6c0,"register",&local_1009);
      ::std::__cxx11::string::string(local_6a0,"row_major",&local_100a);
      ::std::__cxx11::string::string(local_680,"RWBuffer",&local_100b);
      ::std::__cxx11::string::string(local_660,"RWByteAddressBuffer",&local_100c);
      ::std::__cxx11::string::string(local_640,"RWStructuredBuffer",&local_100d);
      ::std::__cxx11::string::string(local_620,"RWTexture1D",&local_100e);
      ::std::__cxx11::string::string(local_600,"RWTexture1DArray",&local_100f);
      ::std::__cxx11::string::string(local_5e0,"RWTexture2D",&local_1010);
      ::std::__cxx11::string::string(local_5c0,"RWTexture2DArray",&local_1011);
      ::std::__cxx11::string::string(local_5a0,"RWTexture3D",&local_1012);
      ::std::__cxx11::string::string(local_580,"sample",&local_1013);
      ::std::__cxx11::string::string(local_560,"sampler",&local_1014);
      ::std::__cxx11::string::string(local_540,"SamplerState",&local_1015);
      ::std::__cxx11::string::string(local_520,"SamplerComparisonState",&local_1016);
      ::std::__cxx11::string::string(local_500,"shared",&local_1017);
      ::std::__cxx11::string::string(local_4e0,"snorm",&local_1018);
      ::std::__cxx11::string::string(local_4c0,"stateblock",&local_1019);
      ::std::__cxx11::string::string(local_4a0,"stateblock_state",&local_101a);
      ::std::__cxx11::string::string(local_480,"static",&local_101b);
      ::std::__cxx11::string::string(local_460,"string",&local_101c);
      ::std::__cxx11::string::string(local_440,"struct",&local_101d);
      ::std::__cxx11::string::string(local_420,"switch",&local_101e);
      ::std::__cxx11::string::string(local_400,"StructuredBuffer",&local_101f);
      ::std::__cxx11::string::string(local_3e0,"tbuffer",&local_1020);
      ::std::__cxx11::string::string(local_3c0,"technique",&local_1021);
      ::std::__cxx11::string::string(local_3a0,"technique10",&local_1022);
      ::std::__cxx11::string::string(local_380,"technique11",&local_1023);
      ::std::__cxx11::string::string(local_360,"texture",&local_1024);
      ::std::__cxx11::string::string(local_340,"Texture1D",&local_1025);
      ::std::__cxx11::string::string(local_320,"Texture1DArray",&local_1026);
      ::std::__cxx11::string::string(local_300,"Texture2D",&local_1027);
      ::std::__cxx11::string::string(local_2e0,"Texture2DArray",&local_1028);
      ::std::__cxx11::string::string(local_2c0,"Texture2DMS",&local_1029);
      ::std::__cxx11::string::string(local_2a0,"Texture2DMSArray",&local_102a);
      ::std::__cxx11::string::string(local_280,"Texture3D",&local_102b);
      ::std::__cxx11::string::string(local_260,"TextureCube",&local_102c);
      ::std::__cxx11::string::string(local_240,"TextureCubeArray",&local_102d);
      ::std::__cxx11::string::string(local_220,"true",&local_102e);
      ::std::__cxx11::string::string(local_200,"typedef",&local_102f);
      ::std::__cxx11::string::string(local_1e0,"triangle",&local_1030);
      ::std::__cxx11::string::string(local_1c0,"triangleadj",&local_1031);
      ::std::__cxx11::string::string(local_1a0,"TriangleStream",&local_1032);
      ::std::__cxx11::string::string(local_180,"uint",&local_1033);
      ::std::__cxx11::string::string(local_160,"uniform",&local_1034);
      ::std::__cxx11::string::string(local_140,"unorm",&local_1035);
      ::std::__cxx11::string::string(local_120,"unsigned",&local_1036);
      ::std::__cxx11::string::string(local_100,"vector",&local_1037);
      ::std::__cxx11::string::string(local_e0,"vertexfragment",&local_1038);
      ::std::__cxx11::string::string(local_c0,"VertexShader",&local_1039);
      ::std::__cxx11::string::string(local_a0,"vertices",&local_103a);
      ::std::__cxx11::string::string(local_80,"void",&local_103b);
      ::std::__cxx11::string::string(local_60,"volatile",&local_103c);
      ::std::__cxx11::string::string(local_40,"while",&local_103d);
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&replace_illegal_names()::keywords_abi_cxx11_,local_fc0,&stack0xffffffffffffffe0
                 ,0,&local_103e,&local_103f,&local_1040);
      lVar2 = 0xf80;
      do {
        ::std::__cxx11::string::~string(local_fc0 + lVar2);
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x20);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&replace_illegal_names()::keywords_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&replace_illegal_names()::keywords_abi_cxx11_);
    }
  }
  CompilerGLSL::replace_illegal_names
            (&this->super_CompilerGLSL,&replace_illegal_names()::keywords_abi_cxx11_);
  CompilerGLSL::replace_illegal_names(&this->super_CompilerGLSL);
  return;
}

Assistant:

void CompilerHLSL::replace_illegal_names()
{
	static const unordered_set<string> keywords = {
		// Additional HLSL specific keywords.
		// From https://docs.microsoft.com/en-US/windows/win32/direct3dhlsl/dx-graphics-hlsl-appendix-keywords
		"AppendStructuredBuffer", "asm", "asm_fragment",
		"BlendState", "bool", "break", "Buffer", "ByteAddressBuffer",
		"case", "cbuffer", "centroid", "class", "column_major", "compile",
		"compile_fragment", "CompileShader", "const", "continue", "ComputeShader",
		"ConsumeStructuredBuffer",
		"default", "DepthStencilState", "DepthStencilView", "discard", "do",
		"double", "DomainShader", "dword",
		"else", "export", "false", "float", "for", "fxgroup",
		"GeometryShader", "groupshared", "half", "HullShader",
		"indices", "if", "in", "inline", "inout", "InputPatch", "int", "interface",
		"line", "lineadj", "linear", "LineStream",
		"matrix", "min16float", "min10float", "min16int", "min16uint",
		"namespace", "nointerpolation", "noperspective", "NULL",
		"out", "OutputPatch",
		"payload", "packoffset", "pass", "pixelfragment", "PixelShader", "point",
		"PointStream", "precise", "RasterizerState", "RenderTargetView",
		"return", "register", "row_major", "RWBuffer", "RWByteAddressBuffer",
		"RWStructuredBuffer", "RWTexture1D", "RWTexture1DArray", "RWTexture2D",
		"RWTexture2DArray", "RWTexture3D", "sample", "sampler", "SamplerState",
		"SamplerComparisonState", "shared", "snorm", "stateblock", "stateblock_state",
		"static", "string", "struct", "switch", "StructuredBuffer", "tbuffer",
		"technique", "technique10", "technique11", "texture", "Texture1D",
		"Texture1DArray", "Texture2D", "Texture2DArray", "Texture2DMS", "Texture2DMSArray",
		"Texture3D", "TextureCube", "TextureCubeArray", "true", "typedef", "triangle",
		"triangleadj", "TriangleStream", "uint", "uniform", "unorm", "unsigned",
		"vector", "vertexfragment", "VertexShader", "vertices", "void", "volatile", "while",
	};

	CompilerGLSL::replace_illegal_names(keywords);
	CompilerGLSL::replace_illegal_names();
}